

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGValidateDatatype
              (xmlRelaxNGValidCtxtPtr ctxt,xmlChar *value,xmlRelaxNGDefinePtr_conflict define,
              xmlNodePtr node)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  xmlChar *oldendvalue;
  xmlChar *oldvalue;
  xmlRelaxNGDefinePtr_conflict cur;
  void *result;
  xmlRelaxNGTypeLibraryPtr lib;
  int tmp;
  int ret;
  xmlNodePtr node_local;
  xmlRelaxNGDefinePtr_conflict define_local;
  xmlChar *value_local;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  cur = (xmlRelaxNGDefinePtr_conflict)0x0;
  if ((define == (xmlRelaxNGDefinePtr_conflict)0x0) || (define->data == (void *)0x0)) {
    ctxt_local._4_4_ = -1;
  }
  else {
    result = define->data;
    _tmp = node;
    node_local = (xmlNodePtr)define;
    define_local = (xmlRelaxNGDefinePtr_conflict)value;
    value_local = (xmlChar *)ctxt;
    if (*(long *)((long)result + 0x18) == 0) {
      lib._4_4_ = -1;
    }
    else if ((define->attrs == (xmlRelaxNGDefinePtr)0x0) ||
            (define->attrs->type != XML_RELAXNG_PARAM)) {
      lib._4_4_ = (**(code **)((long)result + 0x18))
                            (*(undefined8 *)((long)result + 8),define->name,value,0);
    }
    else {
      lib._4_4_ = (**(code **)((long)result + 0x18))
                            (*(undefined8 *)((long)result + 8),define->name,value,&cur);
    }
    if (lib._4_4_ < 0) {
      xmlRelaxNGAddValidError
                ((xmlRelaxNGValidCtxtPtr)value_local,XML_RELAXNG_ERR_TYPE,node_local->name,
                 (xmlChar *)0x0,0);
      if (((cur != (xmlRelaxNGDefinePtr_conflict)0x0) && (result != (void *)0x0)) &&
         (*(long *)((long)result + 0x30) != 0)) {
        (**(code **)((long)result + 0x30))(*(undefined8 *)((long)result + 8),cur);
      }
      ctxt_local._4_4_ = -1;
    }
    else {
      if (lib._4_4_ == 1) {
        lib._4_4_ = 0;
      }
      else if (lib._4_4_ == 2) {
        xmlRelaxNGAddValidError
                  ((xmlRelaxNGValidCtxtPtr)value_local,XML_RELAXNG_ERR_DUPID,(xmlChar *)define_local
                   ,(xmlChar *)0x0,1);
      }
      else {
        xmlRelaxNGAddValidError
                  ((xmlRelaxNGValidCtxtPtr)value_local,XML_RELAXNG_ERR_TYPEVAL,node_local->name,
                   (xmlChar *)define_local,1);
        lib._4_4_ = -1;
      }
      oldvalue = (xmlChar *)node_local->ns;
      while( true ) {
        bVar3 = false;
        if ((lib._4_4_ == 0) && (bVar3 = false, oldvalue != (xmlChar *)0x0)) {
          bVar3 = *(int *)oldvalue == 6;
        }
        if (!bVar3) break;
        if ((*(long *)((long)result + 0x28) != 0) &&
           (lib._0_4_ = (**(code **)((long)result + 0x28))
                                  (*(undefined8 *)((long)result + 8),node_local->name,
                                   *(undefined8 *)(oldvalue + 0x10),*(undefined8 *)(oldvalue + 0x20)
                                   ,define_local,cur), (int)lib != 0)) {
          lib._4_4_ = -1;
        }
        oldvalue = *(xmlChar **)(oldvalue + 0x40);
      }
      if ((lib._4_4_ == 0) && (node_local->next != (_xmlNode *)0x0)) {
        uVar1 = *(undefined8 *)(*(long *)(value_local + 0x60) + 0x20);
        uVar2 = *(undefined8 *)(*(long *)(value_local + 0x60) + 0x28);
        *(xmlRelaxNGDefinePtr_conflict *)(*(long *)(value_local + 0x60) + 0x20) = define_local;
        *(undefined8 *)(*(long *)(value_local + 0x60) + 0x28) = 0;
        lib._4_4_ = xmlRelaxNGValidateValue
                              ((xmlRelaxNGValidCtxtPtr)value_local,
                               (xmlRelaxNGDefinePtr_conflict)node_local->next);
        *(undefined8 *)(*(long *)(value_local + 0x60) + 0x20) = uVar1;
        *(undefined8 *)(*(long *)(value_local + 0x60) + 0x28) = uVar2;
      }
      if (((cur != (xmlRelaxNGDefinePtr_conflict)0x0) && (result != (void *)0x0)) &&
         (*(long *)((long)result + 0x30) != 0)) {
        (**(code **)((long)result + 0x30))(*(undefined8 *)((long)result + 8),cur);
      }
      ctxt_local._4_4_ = lib._4_4_;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlRelaxNGValidateDatatype(xmlRelaxNGValidCtxtPtr ctxt,
                           const xmlChar * value,
                           xmlRelaxNGDefinePtr define, xmlNodePtr node)
{
    int ret, tmp;
    xmlRelaxNGTypeLibraryPtr lib;
    void *result = NULL;
    xmlRelaxNGDefinePtr cur;

    if ((define == NULL) || (define->data == NULL)) {
        return (-1);
    }
    lib = (xmlRelaxNGTypeLibraryPtr) define->data;
    if (lib->check != NULL) {
        if ((define->attrs != NULL) &&
            (define->attrs->type == XML_RELAXNG_PARAM)) {
            ret =
                lib->check(lib->data, define->name, value, &result, node);
        } else {
            ret = lib->check(lib->data, define->name, value, NULL, node);
        }
    } else
        ret = -1;
    if (ret < 0) {
        VALID_ERR2(XML_RELAXNG_ERR_TYPE, define->name);
        if ((result != NULL) && (lib != NULL) && (lib->freef != NULL))
            lib->freef(lib->data, result);
        return (-1);
    } else if (ret == 1) {
        ret = 0;
    } else if (ret == 2) {
        VALID_ERR2P(XML_RELAXNG_ERR_DUPID, value);
    } else {
        VALID_ERR3P(XML_RELAXNG_ERR_TYPEVAL, define->name, value);
        ret = -1;
    }
    cur = define->attrs;
    while ((ret == 0) && (cur != NULL) && (cur->type == XML_RELAXNG_PARAM)) {
        if (lib->facet != NULL) {
            tmp = lib->facet(lib->data, define->name, cur->name,
                             cur->value, value, result);
            if (tmp != 0)
                ret = -1;
        }
        cur = cur->next;
    }
    if ((ret == 0) && (define->content != NULL)) {
        const xmlChar *oldvalue, *oldendvalue;

        oldvalue = ctxt->state->value;
        oldendvalue = ctxt->state->endvalue;
        ctxt->state->value = (xmlChar *) value;
        ctxt->state->endvalue = NULL;
        ret = xmlRelaxNGValidateValue(ctxt, define->content);
        ctxt->state->value = (xmlChar *) oldvalue;
        ctxt->state->endvalue = (xmlChar *) oldendvalue;
    }
    if ((result != NULL) && (lib != NULL) && (lib->freef != NULL))
        lib->freef(lib->data, result);
    return (ret);
}